

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_b72d1::Number<char>::~Number(Number<char> *this)

{
  uint uVar1;
  Number<char> *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Number_002ecad8;
  uVar1 = this->base_;
  if (uVar1 == 8) {
    pstore::dump::number_base::oct();
  }
  else if (uVar1 == 10) {
    pstore::dump::number_base::dec();
  }
  else {
    if (uVar1 != 0x10) {
      pstore::assert_failed
                ("false",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_number.cpp"
                 ,0x2a);
    }
    pstore::dump::number_base::hex();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->out_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

~Number () override {
            using namespace ::pstore::dump;
            switch (base_) {
            case 8: number_base::oct (); break;
            case 10: number_base::dec (); break;
            case 16: number_base::hex (); break;
            default: PSTORE_ASSERT (false); break;
            }
        }